

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O0

void * __thiscall
boost::object_pool<test_handler_class,_boost::default_user_allocator_new_delete>::malloc
          (object_pool<test_handler_class,_boost::default_user_allocator_new_delete> *this,
          size_t __size)

{
  void *pvVar1;
  
  store(this);
  pvVar1 = pool<boost::default_user_allocator_new_delete>::ordered_malloc
                     (&this->super_pool<boost::default_user_allocator_new_delete>);
  return pvVar1;
}

Assistant:

element_type * malloc BOOST_PREVENT_MACRO_SUBSTITUTION()
    { //! Allocates memory that can hold one object of type ElementType.
      //!
      //! If out of memory, returns 0. 
      //!
      //! Amortized O(1).
      return static_cast<element_type *>(store().ordered_malloc());
    }